

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

void mcmcswf(mcmcx1def *ctx,mcmon objn,mcsseg swapn,mcsseg oldswapn)

{
  ushort uVar1;
  mcmodef *pmVar2;
  byte bVar3;
  undefined6 in_register_00000032;
  
  bVar3 = (byte)objn;
  pmVar2 = ctx->mcmcxtab[CONCAT62(in_register_00000032,objn) >> 8 & 0xffffff];
  uVar1 = pmVar2[bVar3].mcmoflg;
  if ((uVar1 & 3) == 0) {
    if ((uVar1 & 8) == 0) {
      return;
    }
  }
  else if (((uVar1 & 8) == 0) && (pmVar2[bVar3].mcmoloc.mcmolocs != oldswapn)) {
    return;
  }
  pmVar2[bVar3].mcmoloc.mcmolocs = swapn;
  return;
}

Assistant:

void mcmcswf(mcmcx1def *ctx, mcmon objn, mcsseg swapn, mcsseg oldswapn)
{
    mcmodef *o = mcmgobje(ctx, objn);
    
    MCMGLBCTX(ctx);
    
    /*
     *   Reset the swap number only if the object is swapped out and its
     *   swap file number matches the old one, or the object is currently
     *   present (in which case the swap file number is irrelevant and can
     *   be replaced).  
     */
    if (((o->mcmoflg & (MCMOFDIRTY | MCMOFNODISC)) && o->mcmoswh == oldswapn)
        || (o->mcmoflg & MCMOFPRES))
        o->mcmoswh = swapn;
}